

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

_Bool read_byte_sign_extended(m680x_info *info,int16_t *word,uint16_t address)

{
  uint16_t address_local;
  int16_t *word_local;
  m680x_info *info_local;
  _Bool local_1;
  
  if ((uint)address - (uint)info->offset < info->size) {
    *word = (ushort)info->code[(int)((uint)address - (uint)info->offset)];
    if ((*word & 0x80U) != 0) {
      *word = *word | 0xff00;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool read_byte_sign_extended(const m680x_info *info, int16_t *word,
	uint16_t address)
{
	if (address - info->offset >= info->size)
		// out of code buffer range
		return false;

	*word = (int16_t) info->code[address - info->offset];

	if (*word & 0x80)
		*word |= 0xFF00;

	return true;
}